

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogGetSystem(xmlChar *sysID)

{
  xmlChar *pxVar1;
  void *pvVar2;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  if (xmlCatalogGetSystem::msg == 0) {
    xmlPrintErrorMessage("Use of deprecated xmlCatalogGetSystem() call\n");
    xmlCatalogGetSystem::msg = xmlCatalogGetSystem::msg + 1;
  }
  if (sysID != (xmlChar *)0x0) {
    if ((xmlDefaultCatalog != (xmlCatalogPtr)0x0) &&
       (pxVar1 = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml,(xmlChar *)0x0,sysID),
       &DAT_00000001 < pxVar1 + 1)) {
      snprintf((char *)xmlCatalogGetSystem::result,999,"%s",pxVar1);
      xmlCatalogGetSystem::result[999] = '\0';
      return xmlCatalogGetSystem::result;
    }
    if ((((xmlDefaultCatalog != (xmlCatalogPtr)0x0) &&
         (xmlDefaultCatalog->sgml != (xmlHashTablePtr)0x0)) &&
        (pvVar2 = xmlHashLookup(xmlDefaultCatalog->sgml,sysID), pvVar2 != (void *)0x0)) &&
       (*(int *)((long)pvVar2 + 0x18) == 0xd)) {
      return *(xmlChar **)((long)pvVar2 + 0x30);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlCatalogGetSystem(const xmlChar *sysID) {
    xmlChar *ret;
    static xmlChar result[1000];
    static int msg = 0;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if (msg == 0) {
	xmlPrintErrorMessage(
		"Use of deprecated xmlCatalogGetSystem() call\n");
	msg++;
    }

    if (sysID == NULL)
	return(NULL);

    /*
     * Check first the XML catalogs
     */
    if (xmlDefaultCatalog != NULL) {
	ret = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml, NULL, sysID);
	if ((ret != NULL) && (ret != XML_CATAL_BREAK)) {
	    snprintf((char *) result, sizeof(result) - 1, "%s", (char *) ret);
	    result[sizeof(result) - 1] = 0;
	    return(result);
	}
    }

    if (xmlDefaultCatalog != NULL)
	return(xmlCatalogGetSGMLSystem(xmlDefaultCatalog->sgml, sysID));
    return(NULL);
}